

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

string_type * __thiscall
parser::state::string_abi_cxx11_(string_type *__return_storage_ptr__,state *this,posn *p,ind n)

{
  range_type iters;
  range_type local_58;
  
  range(&local_58,this,p,n);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<std::_Deque_iterator<char,char&,char*>>
            ((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string_type string(const struct posn& p, ind n) {
			range_type iters = range(p, n);
			return string_type(iters.first, iters.second);
		}